

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

void __thiscall
cmLocalGenerator::AppendCompileOptions
          (cmLocalGenerator *this,string *options,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *options_vec,char *regex)

{
  pointer pbVar1;
  bool bVar2;
  string *opt;
  pointer pbVar3;
  RegularExpression r;
  RegularExpression local_f8;
  
  if (regex == (char *)0x0) {
    pbVar1 = (options_vec->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar3 = (options_vec->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar1; pbVar3 = pbVar3 + 1)
    {
      (*this->_vptr_cmLocalGenerator[8])(this,options,pbVar3);
    }
  }
  else {
    local_f8.regmatch.startp[0] = (char *)0x0;
    local_f8.regmatch.endp[0] = (char *)0x0;
    local_f8.regmatch.searchstring = (char *)0x0;
    local_f8.program = (char *)0x0;
    cmsys::RegularExpression::compile(&local_f8,regex);
    pbVar1 = (options_vec->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar3 = (options_vec->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar1; pbVar3 = pbVar3 + 1)
    {
      bVar2 = cmsys::RegularExpression::find
                        (&local_f8,(pbVar3->_M_dataplus)._M_p,&local_f8.regmatch);
      if (bVar2) {
        (*this->_vptr_cmLocalGenerator[8])(this,options,pbVar3);
      }
    }
    if (local_f8.program != (char *)0x0) {
      operator_delete__(local_f8.program);
    }
  }
  return;
}

Assistant:

void cmLocalGenerator::AppendCompileOptions(
  std::string& options, const std::vector<std::string>& options_vec,
  const char* regex) const
{
  if (regex != nullptr) {
    // Filter flags upon specified reges.
    cmsys::RegularExpression r(regex);

    for (std::string const& opt : options_vec) {
      if (r.find(opt)) {
        this->AppendFlagEscape(options, opt);
      }
    }
  } else {
    for (std::string const& opt : options_vec) {
      this->AppendFlagEscape(options, opt);
    }
  }
}